

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void printTo<int,char,String>(FILE *fp,String *fmtstr,int *args,char *args_1,String *args_2)

{
  char *local_30 [4];
  
  format<int,char,String>((String *)local_30,fmtstr,args,args_1,args_2);
  fputs(local_30[0],(FILE *)fp);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void printTo (FILE* fp, const String& fmtstr, const argtypes&... args)
{
	fprintf (fp, "%s", format (fmtstr, args...).c_str());
}